

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMacroCommand.cxx
# Opt level: O3

void __thiscall cmMacroHelperCommand::~cmMacroHelperCommand(cmMacroHelperCommand *this)

{
  ~cmMacroHelperCommand(this);
  operator_delete(this,0xa0);
  return;
}

Assistant:

~cmMacroHelperCommand() CM_OVERRIDE {}